

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall Imf_2_5::CompositeDeepScanLine::Data::check_valid(Data *this,Header *header)

{
  bool bVar1;
  ArgExc *pAVar2;
  size_type sVar3;
  Header *this_00;
  reference ppDVar4;
  Box2i *src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Header *match_header;
  string n;
  ConstIterator i;
  bool has_alpha;
  bool has_z;
  Box<Imath_2_5::Vec2<int>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined5 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  Box<Imath_2_5::Vec2<int>_> *in_stack_ffffffffffffff80;
  allocator<char> *__s;
  allocator<char> local_49;
  string local_48 [32];
  const_iterator local_28;
  const_iterator local_20;
  byte local_12;
  byte local_11;
  
  local_11 = 0;
  local_12 = 0;
  Header::channels((Header *)0x1d99d1);
  local_20._M_node = (_Base_ptr)ChannelList::begin((ChannelList *)in_stack_ffffffffffffff48);
  while( true ) {
    Header::channels((Header *)0x1d99ee);
    local_28._M_node = (_Base_ptr)ChannelList::end((ChannelList *)in_stack_ffffffffffffff48);
    bVar1 = Imf_2_5::operator!=((ConstIterator *)in_stack_ffffffffffffff50,
                                (ConstIterator *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    in_stack_ffffffffffffff80 =
         (Box<Imath_2_5::Vec2<int>_> *)ChannelList::ConstIterator::name((ConstIterator *)0x1d9a29);
    __s = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,(char *)__s,(allocator<char> *)in_stack_ffffffffffffff80);
    std::allocator<char>::~allocator(&local_49);
    in_stack_ffffffffffffff7f =
         std::operator==(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    if ((bool)in_stack_ffffffffffffff7f) {
      in_RDI[3]._M_dataplus = (_Alloc_hider)0x1;
    }
    else {
      in_stack_ffffffffffffff7e =
           std::operator==(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
      if ((bool)in_stack_ffffffffffffff7e) {
        local_11 = 1;
      }
      else {
        in_stack_ffffffffffffff7d =
             std::operator==(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
        if ((bool)in_stack_ffffffffffffff7d) {
          local_12 = 1;
        }
      }
    }
    std::__cxx11::string::~string(local_48);
    ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_ffffffffffffff50);
  }
  if ((local_11 & 1) != 0) {
    if ((local_12 & 1) == 0) {
      pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc
                (pAVar2,"Deep data provided to CompositeDeepScanLine is missing an alpha channel");
      __cxa_throw(pAVar2,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    sVar3 = std::
            vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
            ::size((vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                    *)((long)&in_RDI->field_2 + 8));
    if ((sVar3 == 0) &&
       (sVar3 = std::
                vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                ::size((vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                        *)in_RDI), sVar3 == 0)) {
      Header::dataWindow((Header *)0x1d9beb);
      Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator=
                ((Box<Imath_2_5::Vec2<int>_> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    else {
      sVar3 = std::
              vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
              ::size((vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                      *)((long)&in_RDI->field_2 + 8));
      if (sVar3 == 0) {
        ppDVar4 = std::
                  vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                  ::operator[]((vector<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                                *)in_RDI,0);
        this_00 = DeepScanLineInputFile::header(*ppDVar4);
      }
      else {
        std::
        vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
        ::operator[]((vector<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
                      *)((long)&in_RDI->field_2 + 8),0);
        this_00 = DeepScanLineInputPart::header((DeepScanLineInputPart *)0x1d9c32);
      }
      src = Header::displayWindow((Header *)0x1d9c68);
      Header::displayWindow((Header *)0x1d9c7a);
      bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator!=
                        ((Box<Imath_2_5::Vec2<int>_> *)this_00,src);
      if (bVar1) {
        pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc
                  (pAVar2,
                   "Deep data provided to CompositeDeepScanLine has a different displayWindow to previously provided data"
                  );
        __cxa_throw(pAVar2,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      Header::dataWindow((Header *)0x1d9cdf);
      Imath_2_5::Box<Imath_2_5::Vec2<int>_>::extendBy
                (in_stack_ffffffffffffff80,
                 (Box<Imath_2_5::Vec2<int>_> *)
                 CONCAT17(in_stack_ffffffffffffff7f,
                          CONCAT16(in_stack_ffffffffffffff7e,
                                   CONCAT15(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff78))));
    }
    return;
  }
  pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc
            (pAVar2,"Deep data provided to CompositeDeepScanLine is missing a Z channel");
  __cxa_throw(pAVar2,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
CompositeDeepScanLine::Data::check_valid(const Header & header)
{

    bool has_z=false;
    bool has_alpha=false;
    // check good channel names
    for( ChannelList::ConstIterator i=header.channels().begin();i!=header.channels().end();++i)
    {
        std::string n(i.name()); 
        if(n=="ZBack")
        {
            _zback=true;
        }
        else if(n=="Z")
        {
            has_z=true;
        }
        else if(n=="A")
        {
            has_alpha=true;
        }
    }
    
    if(!has_z)
    {
        throw IEX_NAMESPACE::ArgExc("Deep data provided to CompositeDeepScanLine is missing a Z channel");
    }
    
    if(!has_alpha)
    {
        throw IEX_NAMESPACE::ArgExc("Deep data provided to CompositeDeepScanLine is missing an alpha channel");
    }
    
    
    if(_part.size()==0 && _file.size()==0)
    {
       // first in - update and return

       _dataWindow = header.dataWindow();
       
       return;
    }
    
    
    const Header * const match_header = _part.size()>0 ? &_part[0]->header() : &_file[0]->header();
    
    // check the sizes match
    if(match_header->displayWindow() != header.displayWindow())
    {
        throw IEX_NAMESPACE::ArgExc("Deep data provided to CompositeDeepScanLine has a different displayWindow to previously provided data");
    }
    
    _dataWindow.extendBy(header.dataWindow());
    
}